

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O0

void __thiscall Am_Value_List_Data::Make_Empty(Am_Value_List_Data *this)

{
  Am_List_Item *pAVar1;
  Am_List_Item *local_20;
  Am_List_Item *curr;
  Am_List_Item *next;
  Am_Value_List_Data *this_local;
  
  pAVar1 = this->head;
  while (local_20 = pAVar1, local_20 != (Am_List_Item *)0x0) {
    pAVar1 = local_20->next;
    local_20->next = (Am_List_Item *)0x0;
    local_20->prev = (Am_List_Item *)0x0;
    if (local_20 != (Am_List_Item *)0x0) {
      Am_List_Item::~Am_List_Item(local_20);
      operator_delete(local_20);
    }
  }
  this->head = (Am_List_Item *)0x0;
  this->tail = (Am_List_Item *)0x0;
  *(undefined2 *)&(this->super_Am_Wrapper).field_0xc = 0;
  return;
}

Assistant:

void
Am_Value_List_Data::Make_Empty()
{
  Am_List_Item *next;
  for (Am_List_Item *curr = head; curr; curr = next) {
    next = curr->next;
    curr->next = nullptr;
    curr->prev = nullptr;
    delete curr;
  }
  head = nullptr;
  tail = nullptr;
  number = 0;
}